

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::increaseIntensity_repair_abi_cxx11_
          (Station *this,int beam,double intensity,int ratio)

{
  int y_00;
  int iVar1;
  int i_00;
  int iVar2;
  int iVar3;
  pair<int,_int> pVar4;
  double *pdVar5;
  size_type sVar6;
  long in_RSI;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_RDI;
  double in_XMM0_Qa;
  int j_6;
  int j_5;
  int j_4;
  int j_3;
  double max_value_1;
  int max_j_1;
  int i_1;
  int j_2;
  int j_1;
  int j;
  double max_value;
  int max_j;
  int i;
  int y;
  int x;
  pair<int,_int> p;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff;
  int in_stack_fffffffffffffe74;
  Station *in_stack_fffffffffffffe78;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  int iVar7;
  undefined4 in_stack_fffffffffffffed4;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  undefined8 in_stack_fffffffffffffef0;
  double dVar8;
  double in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  double local_78;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  double local_58;
  int local_4c;
  int local_48;
  int iStack_2c;
  
  increaseIntensity_abi_cxx11_
            ((Station *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),in_stack_fffffffffffffef8,
             (int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
  pVar4 = getPos(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
  iStack_2c = pVar4.second;
  if (in_XMM0_Qa <= 0.0) {
    local_68 = 0;
    while (iVar1 = local_68, i_00 = Collimator::getXdim(*(Collimator **)(in_RSI + 0xb0)),
          iVar1 < i_00) {
      local_6c = 0;
      local_78 = -1.0;
      iVar7 = iStack_2c;
      iVar2 = Collimator::getYdim(*(Collimator **)(in_RSI + 0xb0));
      if (iVar7 < iVar2 / 2) {
        in_stack_fffffffffffffecc = Collimator::getYdim(*(Collimator **)(in_RSI + 0xb0));
        local_7c = in_stack_fffffffffffffecc;
        while (local_7c = local_7c + -1, iVar3 = local_6c, -1 < local_7c) {
          pdVar5 = maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),local_68,local_7c);
          if (local_78 < *pdVar5) {
            local_6c = local_7c;
            pdVar5 = maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),local_68,local_7c);
            local_78 = *pdVar5;
          }
        }
      }
      else {
        local_80 = 0;
        while (in_stack_fffffffffffffeb0 = local_80,
              in_stack_fffffffffffffeb4 = Collimator::getYdim(*(Collimator **)(in_RSI + 0xb0)),
              iVar3 = local_6c, in_stack_fffffffffffffeb0 < in_stack_fffffffffffffeb4) {
          in_stack_fffffffffffffea8 =
               (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),local_68,local_80);
          if (local_78 <
              (double)(in_stack_fffffffffffffea8->
                      super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      )._M_impl._M_node.super__List_node_base._M_next) {
            local_6c = local_80;
            pdVar5 = maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),local_68,local_80);
            local_78 = *pdVar5;
          }
          local_80 = local_80 + 1;
        }
      }
      while( true ) {
        y_00 = iVar3;
        local_84 = y_00 + 1;
        iVar3 = Collimator::getYdim(*(Collimator **)(in_RSI + 0xb0));
        if (iVar3 <= local_84) break;
        pdVar5 = maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),local_68,local_84);
        dVar8 = *pdVar5;
        pdVar5 = maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),local_68,y_00);
        iVar3 = local_84;
        if (*pdVar5 <= dVar8 && dVar8 != *pdVar5) {
          maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),local_68,y_00);
          change_intensity((Station *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           i_00,iVar1,(double)CONCAT44(iVar2,iVar7),
                           (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                           )CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          iVar3 = local_84;
        }
      }
      while (iVar3 = local_6c, local_88 = iVar3 + -1, -1 < local_88) {
        pdVar5 = maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),local_68,local_88);
        dVar8 = *pdVar5;
        pdVar5 = maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),local_68,iVar3);
        local_6c = local_88;
        if (*pdVar5 <= dVar8 && dVar8 != *pdVar5) {
          maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),local_68,iVar3);
          change_intensity((Station *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           i_00,iVar1,(double)CONCAT44(iVar2,iVar7),
                           (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                           )CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          local_6c = local_88;
        }
      }
      local_68 = local_68 + 1;
    }
  }
  else {
    for (local_48 = 0; iVar1 = Collimator::getXdim(*(Collimator **)(in_RSI + 0xb0)),
        local_48 < iVar1; local_48 = local_48 + 1) {
      local_4c = 0;
      local_58 = -1.0;
      for (local_5c = 0; iVar1 = Collimator::getYdim(*(Collimator **)(in_RSI + 0xb0)),
          local_5c < iVar1; local_5c = local_5c + 1) {
        pdVar5 = maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),local_48,local_5c);
        if (local_58 < *pdVar5) {
          local_4c = local_5c;
          pdVar5 = maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),local_48,local_5c);
          local_58 = *pdVar5;
        }
      }
      for (local_60 = 1; local_60 < local_4c; local_60 = local_60 + 1) {
        pdVar5 = maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),local_48,local_60);
        dVar8 = *pdVar5;
        pdVar5 = maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),local_48,local_60 + -1);
        if (dVar8 < *pdVar5) {
          maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),local_48,local_60 + -1);
          change_intensity((Station *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
                           (double)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                           (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                           )CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        }
      }
      local_64 = Collimator::getYdim(*(Collimator **)(in_RSI + 0xb0));
      for (local_64 = local_64 + -2; local_4c < local_64; local_64 = local_64 + -1) {
        pdVar5 = maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),local_48,local_64);
        dVar8 = *pdVar5;
        pdVar5 = maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),local_48,local_64 + 1);
        if (dVar8 < *pdVar5) {
          in_stack_fffffffffffffee0 = local_48;
          in_stack_fffffffffffffee4 = local_64;
          maths::Matrix::operator()((Matrix *)(in_RSI + 0xb8),local_48,local_64 + 1);
          change_intensity((Station *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
                           (double)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                           (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                           )CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        }
      }
    }
  }
  while (sVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 size((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      0x1449b3), (ulong)(long)*(int *)(in_RSI + 0x40) < sVar6) {
    reduce_apertures((Station *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     in_stack_fffffffffffffea8);
  }
  return in_RDI;
}

Assistant:

list< pair< int, double > > Station::increaseIntensity_repair(int beam, double intensity, int ratio){
    list< pair< int, double > > diff=increaseIntensity(beam, intensity, ratio);

    pair<int,int> p = getPos(beam);
    int x=p.first, y=p.second;

    if(intensity > 0.0) //reparation (phase 1A)

    for(int i=0; i<collimator.getXdim(); i++){
      int max_j=0; double max_value=-1;
      for(int j=0; j<collimator.getYdim(); j++)
         if(I(i,j)>max_value) {max_j=j; max_value=I(i,j);}

      for(int j=1; j<max_j; j++)
        if(I(i,j) < I(i,j-1))
            change_intensity(i, j, I(i,j-1), &diff);

      for(int j=collimator.getYdim()-2; j>max_j; j--)
        if(I(i,j) < I(i,j+1))
             change_intensity(i, j, I(i,j+1), &diff);
    }

    else //reparation (phase 1B)

    for(int i=0; i<collimator.getXdim(); i++){
      int max_j=0; double max_value=-1;

      if(y<collimator.getYdim()/2){
        for(int j=collimator.getYdim()-1; j>=0; j--)
          if(I(i,j)>max_value) {max_j=j; max_value=I(i,j);}
      }else{
        for(int j=0; j<collimator.getYdim(); j++)
          if(I(i,j)>max_value) {max_j=j; max_value=I(i,j);}
      }

      for(int j=max_j+1; j<collimator.getYdim(); j++)
        if(I(i,j) > I(i,j-1))
             change_intensity(i, j, I(i,j-1), &diff);

      for(int j=max_j-1; j>=0; j--)
        if(I(i,j) > I(i,j+1))
              change_intensity(i, j, I(i,j+1), &diff);
    }

    //reparation (phase 2)
    while(int2nb.size()>max_apertures)
    	reduce_apertures(diff);


    return diff;
  }